

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

pool_ptr<soul::AST::Processor> __thiscall
soul::StructuralParser::parseTopLevelItem<soul::AST::Processor>
          (StructuralParser *this,CodeLocation *processorKeywordLocation,ModuleBase *parentModule)

{
  SourceCodeText *pSVar1;
  SourceCodeText *o;
  bool bVar2;
  QualifiedIdentifier *args_2;
  long lVar3;
  Processor *pPVar4;
  long in_RCX;
  pool_ptr<soul::AST::Expression> specialisationArgs;
  Identifier name;
  Context context;
  anon_class_8_1_e78d0acc local_b8;
  Ptr local_b0;
  UTF8Reader local_a8;
  Context local_a0;
  undefined1 local_88 [16];
  undefined1 local_78 [72];
  
  local_a0.location.sourceCode.object = (SourceCodeText *)processorKeywordLocation[1].location.data;
  if (local_a0.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_a0.location.location.data = (char *)processorKeywordLocation[2].sourceCode.object;
  local_a0.parentScope = (Scope *)processorKeywordLocation[8].location.data;
  local_a8.data =
       (char *)parseIdentifierWithMaxLength((StructuralParser *)processorKeywordLocation,0x80);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                      *)processorKeywordLocation,(TokenType)0x259fb3);
  if (bVar2) {
    args_2 = parseQualifiedIdentifier((StructuralParser *)processorKeywordLocation);
    parseSpecialisationArgs((StructuralParser *)&local_b8);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>
              ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                *)processorKeywordLocation,(TokenType)0x2585e7);
    local_78._8_8_ =
         PoolAllocator::
         allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::Expression>&>
                   ((PoolAllocator *)processorKeywordLocation[7].location.data,&local_a0,
                    (Identifier *)&local_a8,args_2,(pool_ptr<soul::AST::Expression> *)&local_b8);
    std::
    vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>
              ((vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
                *)(in_RCX + 0x80),(pool_ref<soul::AST::NamespaceAliasDeclaration> *)(local_78 + 8));
    (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
    goto LAB_001d2797;
  }
  lVar3 = __dynamic_cast();
  if (lVar3 == 0) {
    CompileMessageHelpers::createMessage<>
              ((CompileMessage *)(local_78 + 0x10),syntax,error,
               "A namespace can only be defined inside a namespace");
    AST::Context::throwError(&local_a0,(CompileMessage *)(local_78 + 0x10),false);
  }
  pPVar4 = PoolAllocator::
           allocate<soul::AST::Processor,soul::CodeLocation&,soul::AST::Context&,soul::Identifier&>
                     ((PoolAllocator *)processorKeywordLocation[7].location.data,
                      (CodeLocation *)parentModule,&local_a0,(Identifier *)&local_a8);
  local_b8.newModule = pPVar4;
  std::
  vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>
  ::emplace_back<soul::pool_ref<soul::AST::ModuleBase>>
            ((vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>
              *)(lVar3 + 0x1a0),(pool_ref<soul::AST::ModuleBase> *)&local_b8);
  lVar3 = __dynamic_cast(pPVar4,&AST::Processor::typeinfo,&AST::Namespace::typeinfo,
                         0xfffffffffffffffe);
  pSVar1 = processorKeywordLocation[8].sourceCode.object;
  local_b0.object = (SourceCodeText *)processorKeywordLocation[8].location.data;
  processorKeywordLocation[8].location.data =
       (char *)&(pPVar4->super_ProcessorBase).super_ModuleBase.super_Scope;
  processorKeywordLocation[8].sourceCode.object = (SourceCodeText *)pPVar4;
  if (lVar3 == 0) {
LAB_001d2764:
    parseTopLevelDeclContent((StructuralParser *)processorKeywordLocation);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                        *)processorKeywordLocation,(TokenType)0x259477);
    if (!bVar2) goto LAB_001d2764;
    o = *(SourceCodeText **)(lVar3 + 0x30);
    if (o != (SourceCodeText *)0x0) {
      *(undefined8 *)(lVar3 + 0x30) = 0;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
    }
    *(undefined8 *)(lVar3 + 0x38) = 0;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
    local_88._0_8_ = (parentModule->super_ASTObject)._vptr_ASTObject;
    if ((SourceCodeText *)local_88._0_8_ != (SourceCodeText *)0x0) {
      (((SourceCodeText *)local_88._0_8_)->super_RefCountedObject).refCount =
           (((SourceCodeText *)local_88._0_8_)->super_RefCountedObject).refCount + 1;
    }
    local_88._8_8_ = *(undefined8 *)&(parentModule->super_ASTObject).objectType;
    parseTopLevelItem<soul::AST::Processor>
              ((StructuralParser *)local_78,processorKeywordLocation,(ModuleBase *)local_88);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_88._0_8_);
  }
  processorKeywordLocation[8].sourceCode.object = pSVar1;
  local_b8.newModule = pPVar4;
  std::
  function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
  ::operator=((function<soul::AST::ModuleBase&(soul::AST::Allocator&,soul::AST::Namespace&,std::__cxx11::string_const&)>
               *)&(pPVar4->super_ProcessorBase).super_ModuleBase.createClone,&local_b8);
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)pPVar4;
  processorKeywordLocation[8].location.data = (char *)local_b0.object;
LAB_001d2797:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_a0.location.sourceCode.object);
  return (pool_ptr<soul::AST::Processor>)(Processor *)this;
}

Assistant:

pool_ptr<ModuleType> parseTopLevelItem (CodeLocation processorKeywordLocation, AST::ModuleBase& parentModule)
    {
        auto context = getContext();
        auto name = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matchIf (Operator::assign))
        {
            auto& identifier = parseQualifiedIdentifier();
            auto specialisationArgs = parseSpecialisationArgs();
            expect (Operator::semicolon);
            auto& alias = allocate<AST::NamespaceAliasDeclaration> (context, name, identifier, specialisationArgs);
            parentModule.namespaceAliases.push_back (alias);
            return {};
        }

        auto parentNamespace = cast<AST::Namespace> (parentModule);

        if (parentNamespace == nullptr)
            context.throwError (Errors::namespaceMustBeInsideNamespace());

        auto& newModule = allocate<ModuleType> (processorKeywordLocation, context, name);
        parentNamespace->subModules.push_back (newModule);

        auto newNamespace = cast<AST::Namespace> (newModule);
        ScopedScope scope (*this, newModule);
        auto oldModule = module;
        module = newModule;

        if (newNamespace != nullptr && matchIf (Operator::doubleColon))
        {
            newNamespace->processorKeywordLocation = {};
            parseTopLevelItem<ModuleType> (processorKeywordLocation, *newNamespace);
        }
        else
        {
            parseTopLevelDeclContent();
        }

        module = oldModule;

        newModule.createClone = [&newModule] (AST::Allocator& a, AST::Namespace& parentNS, const std::string& newName) -> AST::ModuleBase&
        {
            return cloneModuleWithNewName (a, parentNS, newModule, newName);
        };

        return newModule;
    }